

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O1

void __thiscall OpenSketch<4U>::heap_up(OpenSketch<4U> *this,int i)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  mapped_type mVar4;
  KV<4U> *pKVar5;
  bool bVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  int __tmp;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  do {
    if (i < 2) {
      return;
    }
    uVar11 = i - 1U >> 1;
    pKVar5 = this->heap;
    iVar1 = pKVar5[(uint)i].first;
    iVar2 = pKVar5[uVar11].first;
    if (iVar1 < iVar2) {
LAB_0010b2b4:
      pKVar5[(uint)i].first = iVar2;
      pKVar5[uVar11].first = iVar1;
      uVar3 = *(undefined4 *)pKVar5[(uint)i].second.str;
      *(undefined4 *)pKVar5[(uint)i].second.str = *(undefined4 *)pKVar5[uVar11].second.str;
      *(undefined4 *)pKVar5[uVar11].second.str = uVar3;
      pmVar7 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->mp,&this->heap[(uint)i].second);
      pmVar8 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->mp,&this->heap[uVar11].second);
      mVar4 = *pmVar7;
      *pmVar7 = *pmVar8;
      *pmVar8 = mVar4;
      bVar6 = true;
      i = uVar11;
    }
    else {
      if (iVar1 <= iVar2) {
        uVar9 = swap_bytes(*(undefined4 *)pKVar5[(uint)i].second.str);
        uVar10 = swap_bytes(*(undefined4 *)pKVar5[uVar11].second.str);
        if ((int)((uint)(uVar10 < uVar9) - (uint)(uVar9 < uVar10)) < 0) goto LAB_0010b2b4;
      }
      bVar6 = false;
    }
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void heap_up(int i) {
		while (i > 1) {
			int parent = (i - 1) / 2;
			if (heap[parent] <= heap[i]) {
				break;
			}
			swap(heap[i], heap[parent]);
			swap(mp[heap[i].second], mp[heap[parent].second]);
			i = parent;
		}
	}